

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

void __thiscall
spirv_cross::CompilerGLSL::emit_declared_builtin_block
          (CompilerGLSL *this,StorageClass storage,ExecutionModel model)

{
  __node_base_ptr *this_00;
  bool bVar1;
  ExecutionModel EVar2;
  uint32_t uVar3;
  uint64_t uVar4;
  CompilerError *pCVar5;
  pointer ppVar6;
  SPIREntryPoint *pSVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_550 [32];
  spirv_cross local_530 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_510 [32];
  spirv_cross local_4f0 [32];
  _Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false> local_4d0;
  key_type local_4c4;
  _Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false> local_4c0;
  iterator itr_3;
  key_type local_4ac;
  _Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false> local_4a8;
  iterator itr_2;
  key_type local_494;
  _Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false> local_490;
  iterator itr_1;
  key_type local_47c;
  _Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false> local_478;
  iterator itr;
  spirv_cross local_450 [39];
  allocator local_429;
  string local_428 [38];
  undefined1 local_402;
  allocator local_401;
  string local_400 [38];
  undefined1 local_3da;
  allocator local_3d9;
  string local_3d8 [32];
  spirv_cross local_3b8 [38];
  undefined1 local_392;
  allocator local_391;
  string local_390 [39];
  allocator local_369;
  string local_368 [38];
  undefined1 local_342;
  allocator local_341;
  string local_340 [39];
  allocator local_319;
  string local_318 [32];
  undefined1 local_2f8 [8];
  SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
  attr;
  Bitset local_1d8;
  anon_class_136_17_646d681b local_188;
  anon_class_1_0_00000001 local_f9;
  undefined1 local_f8 [7];
  anon_class_1_0_00000001 builtin_is_per_vertex_set;
  unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
  builtin_xfb_offsets;
  uint32_t local_b8;
  uint32_t geom_stream;
  uint32_t xfb_buffer;
  uint32_t xfb_stride;
  bool have_any_xfb_offset;
  bool have_geom_stream;
  uint uStack_a8;
  bool have_xfb_buffer_stride;
  uint32_t clip_distance_size;
  uint32_t cull_distance_size;
  bool builtin_array;
  bool emitted_block;
  SPIRVariable *block_var;
  Bitset global_builtins;
  Bitset emitted_builtins;
  ExecutionModel model_local;
  StorageClass storage_local;
  CompilerGLSL *this_local;
  
  this_00 = &global_builtins.higher._M_h._M_single_bucket;
  emitted_builtins.higher._M_h._M_single_bucket._0_4_ = model;
  emitted_builtins.higher._M_h._M_single_bucket._4_4_ = storage;
  Bitset::Bitset((Bitset *)this_00);
  Bitset::Bitset((Bitset *)&block_var);
  _cull_distance_size = 0;
  clip_distance_size._3_1_ = 0;
  clip_distance_size._2_1_ = 0;
  uStack_a8 = 0;
  xfb_stride = 0;
  xfb_buffer._3_1_ = 0;
  xfb_buffer._2_1_ = 0;
  xfb_buffer._1_1_ = 0;
  geom_stream = 0;
  local_b8 = 0;
  builtin_xfb_offsets._M_h._M_single_bucket._4_4_ = 0;
  ::std::
  unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
  ::unordered_map((unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                   *)local_f8);
  local_188.storage = (StorageClass *)((long)&emitted_builtins.higher._M_h._M_single_bucket + 4);
  local_188.builtin_is_per_vertex_set = &local_f9;
  local_188.cull_distance_size = &stack0xffffffffffffff58;
  local_188.clip_distance_size = &xfb_stride;
  local_188.have_any_xfb_offset = (bool *)((long)&xfb_buffer + 1);
  local_188.have_geom_stream = (bool *)((long)&xfb_buffer + 2);
  local_188.geom_stream = (uint32_t *)((long)&builtin_xfb_offsets._M_h._M_single_bucket + 4);
  local_188.have_xfb_buffer_stride = (bool *)((long)&xfb_buffer + 3);
  local_188.xfb_buffer = &local_b8;
  local_188.xfb_stride = &geom_stream;
  local_188.emitted_block = (bool *)((long)&clip_distance_size + 3);
  local_188.builtin_array = (bool *)((long)&clip_distance_size + 2);
  local_188.block_var = (SPIRVariable **)&cull_distance_size;
  local_188.this = this;
  local_188.builtin_xfb_offsets =
       (unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
        *)local_f8;
  local_188.global_builtins = (Bitset *)&block_var;
  local_188.emitted_builtins = (Bitset *)this_00;
  ParsedIR::
  for_each_typed_id<spirv_cross::SPIRVariable,spirv_cross::CompilerGLSL::emit_declared_builtin_block(spv::StorageClass,spv::ExecutionModel)::__0>
            (&(this->super_Compiler).ir,&local_188);
  uVar4 = Bitset::get_lower((Bitset *)&block_var);
  Bitset::Bitset(&local_1d8,(ulong)((uint)uVar4 & 0x1b));
  Bitset::operator=((Bitset *)&block_var,&local_1d8);
  Bitset::~Bitset(&local_1d8);
  if ((clip_distance_size._3_1_ & 1) == 0) {
    Bitset::operator=((Bitset *)&global_builtins.higher._M_h._M_single_bucket,(Bitset *)&block_var);
  }
  bVar1 = Bitset::empty((Bitset *)&global_builtins.higher._M_h._M_single_bucket);
  if (bVar1) {
    attr.stack_storage.aligned_char[0xfc] = '\x01';
    attr.stack_storage.aligned_char[0xfd] = '\0';
    attr.stack_storage.aligned_char[0xfe] = '\0';
    attr.stack_storage.aligned_char[0xff] = '\0';
  }
  else {
    if (emitted_builtins.higher._M_h._M_single_bucket._4_4_ == StorageClassOutput) {
      SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
      ::SmallVector((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                     *)local_2f8);
      if (((xfb_buffer._3_1_ & 1) != 0) && ((xfb_buffer._1_1_ & 1) != 0)) {
        if (((this->options).es & 1U) == 0) {
          if (((this->options).version < 0x1b8) && (0x8b < (this->options).version)) {
            ::std::allocator<char>::allocator();
            ::std::__cxx11::string::string(local_318,"GL_ARB_enhanced_layouts",&local_319);
            require_extension_internal(this,(string *)local_318);
            ::std::__cxx11::string::~string(local_318);
            ::std::allocator<char>::~allocator((allocator<char> *)&local_319);
          }
          else if ((this->options).version < 0x8c) {
            local_342 = 1;
            pCVar5 = (CompilerError *)__cxa_allocate_exception(0x10);
            ::std::allocator<char>::allocator();
            ::std::__cxx11::string::string
                      (local_340,"Component decoration is not supported in targets below GLSL 1.40."
                       ,&local_341);
            CompilerError::CompilerError(pCVar5,(string *)local_340);
            local_342 = 0;
            __cxa_throw(pCVar5,&CompilerError::typeinfo,CompilerError::~CompilerError);
          }
          if ((((this->options).es & 1U) == 0) && ((this->options).version < 0x1b8)) {
            ::std::allocator<char>::allocator();
            ::std::__cxx11::string::string(local_368,"GL_ARB_enhanced_layouts",&local_369);
            require_extension_internal(this,(string *)local_368);
            ::std::__cxx11::string::~string(local_368);
            ::std::allocator<char>::~allocator((allocator<char> *)&local_369);
          }
        }
        else if (((this->options).es & 1U) != 0) {
          local_392 = 1;
          pCVar5 = (CompilerError *)__cxa_allocate_exception(0x10);
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string
                    (local_390,"Need GL_ARB_enhanced_layouts for xfb_stride or xfb_buffer.",
                     &local_391);
          CompilerError::CompilerError(pCVar5,(string *)local_390);
          local_392 = 0;
          __cxa_throw(pCVar5,&CompilerError::typeinfo,CompilerError::~CompilerError);
        }
        join<char_const(&)[14],unsigned_int&,char_const(&)[16],unsigned_int&>
                  (local_3b8,(char (*) [14])"xfb_buffer = ",&local_b8,
                   (char (*) [16])", xfb_stride = ",&geom_stream);
        SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
        ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                     *)local_2f8,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3b8);
        ::std::__cxx11::string::~string((string *)local_3b8);
      }
      if ((xfb_buffer._2_1_ & 1) != 0) {
        EVar2 = Compiler::get_execution_model(&this->super_Compiler);
        if (EVar2 != ExecutionModelGeometry) {
          local_3da = 1;
          pCVar5 = (CompilerError *)__cxa_allocate_exception(0x10);
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string
                    (local_3d8,"Geometry streams can only be used in geometry shaders.",&local_3d9);
          CompilerError::CompilerError(pCVar5,(string *)local_3d8);
          local_3da = 0;
          __cxa_throw(pCVar5,&CompilerError::typeinfo,CompilerError::~CompilerError);
        }
        if (((this->options).es & 1U) != 0) {
          local_402 = 1;
          pCVar5 = (CompilerError *)__cxa_allocate_exception(0x10);
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string
                    (local_400,"Multiple geometry streams not supported in ESSL.",&local_401);
          CompilerError::CompilerError(pCVar5,(string *)local_400);
          local_402 = 0;
          __cxa_throw(pCVar5,&CompilerError::typeinfo,CompilerError::~CompilerError);
        }
        if ((this->options).version < 400) {
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string(local_428,"GL_ARB_transform_feedback3",&local_429);
          require_extension_internal(this,(string *)local_428);
          ::std::__cxx11::string::~string(local_428);
          ::std::allocator<char>::~allocator((allocator<char> *)&local_429);
        }
        join<char_const(&)[10],unsigned_int&>
                  (local_450,(char (*) [10])"stream = ",
                   (uint *)((long)&builtin_xfb_offsets._M_h._M_single_bucket + 4));
        SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
        ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                     *)local_2f8,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_450);
        ::std::__cxx11::string::~string((string *)local_450);
      }
      if ((ExecutionModel)emitted_builtins.higher._M_h._M_single_bucket == ExecutionModelMeshEXT) {
        statement<char_const(&)[24]>(this,(char (*) [24])"out gl_MeshPerVertexEXT");
      }
      else {
        bVar1 = VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::empty((VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)local_2f8);
        if (bVar1) {
          statement<char_const(&)[17]>(this,(char (*) [17])0x5af8f7);
        }
        else {
          merge((spirv_cross *)&itr,
                (SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                 *)local_2f8,", ");
          statement<char_const(&)[8],std::__cxx11::string,char_const(&)[19]>
                    (this,(char (*) [8])"layout(",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&itr,
                     (char (*) [19])") out gl_PerVertex");
          ::std::__cxx11::string::~string((string *)&itr);
        }
      }
      SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
      ::~SmallVector((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                      *)local_2f8);
    }
    else {
      pSVar7 = Compiler::get_entry_point(&this->super_Compiler);
      if ((pSVar7->geometry_passthrough & 1U) == 0) {
        statement<char_const(&)[16]>(this,(char (*) [16])0x5af91c);
      }
      else {
        statement<char_const(&)[36]>(this,(char (*) [36])"layout(passthrough) in gl_PerVertex");
      }
    }
    begin_scope(this);
    bVar1 = Bitset::get((Bitset *)&global_builtins.higher._M_h._M_single_bucket,0);
    if (bVar1) {
      local_47c = 0;
      local_478._M_cur =
           (__node_type *)
           ::std::
           unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
           ::find((unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                   *)local_f8,&local_47c);
      itr_1 = ::std::
              end<std::unordered_map<unsigned_int,unsigned_int,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>>>
                        ((unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                          *)local_f8);
      bVar1 = ::std::__detail::operator!=
                        (&local_478,
                         &itr_1.
                          super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>
                        );
      if (bVar1) {
        ppVar6 = ::std::__detail::
                 _Node_iterator<std::pair<const_unsigned_int,_unsigned_int>,_false,_false>::
                 operator->((_Node_iterator<std::pair<const_unsigned_int,_unsigned_int>,_false,_false>
                             *)&local_478);
        statement<char_const(&)[21],unsigned_int&,char_const(&)[20]>
                  (this,(char (*) [21])"layout(xfb_offset = ",&ppVar6->second,
                   (char (*) [20])") vec4 gl_Position;");
      }
      else {
        statement<char_const(&)[18]>(this,(char (*) [18])0x5af943);
      }
    }
    bVar1 = Bitset::get((Bitset *)&global_builtins.higher._M_h._M_single_bucket,1);
    if (bVar1) {
      local_494 = 1;
      local_490._M_cur =
           (__node_type *)
           ::std::
           unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
           ::find((unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                   *)local_f8,&local_494);
      itr_2 = ::std::
              end<std::unordered_map<unsigned_int,unsigned_int,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>>>
                        ((unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                          *)local_f8);
      bVar1 = ::std::__detail::operator!=
                        (&local_490,
                         &itr_2.
                          super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>
                        );
      if (bVar1) {
        ppVar6 = ::std::__detail::
                 _Node_iterator<std::pair<const_unsigned_int,_unsigned_int>,_false,_false>::
                 operator->((_Node_iterator<std::pair<const_unsigned_int,_unsigned_int>,_false,_false>
                             *)&local_490);
        statement<char_const(&)[21],unsigned_int&,char_const(&)[22]>
                  (this,(char (*) [21])"layout(xfb_offset = ",&ppVar6->second,
                   (char (*) [22])") float gl_PointSize;");
      }
      else {
        statement<char_const(&)[20]>(this,(char (*) [20])0x5af957);
      }
    }
    bVar1 = Bitset::get((Bitset *)&global_builtins.higher._M_h._M_single_bucket,3);
    if (bVar1) {
      local_4ac = 3;
      local_4a8._M_cur =
           (__node_type *)
           ::std::
           unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
           ::find((unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                   *)local_f8,&local_4ac);
      itr_3 = ::std::
              end<std::unordered_map<unsigned_int,unsigned_int,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>>>
                        ((unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                          *)local_f8);
      bVar1 = ::std::__detail::operator!=
                        (&local_4a8,
                         &itr_3.
                          super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>
                        );
      if (bVar1) {
        ppVar6 = ::std::__detail::
                 _Node_iterator<std::pair<const_unsigned_int,_unsigned_int>,_false,_false>::
                 operator->((_Node_iterator<std::pair<const_unsigned_int,_unsigned_int>,_false,_false>
                             *)&local_4a8);
        statement<char_const(&)[21],unsigned_int&,char_const(&)[25],unsigned_int&,char_const(&)[3]>
                  (this,(char (*) [21])"layout(xfb_offset = ",&ppVar6->second,
                   (char (*) [25])") float gl_ClipDistance[",&xfb_stride,(char (*) [3])0x5b704e);
      }
      else {
        statement<char_const(&)[23],unsigned_int&,char_const(&)[3]>
                  (this,(char (*) [23])0x5af96d,&xfb_stride,(char (*) [3])0x5b704e);
      }
    }
    bVar1 = Bitset::get((Bitset *)&global_builtins.higher._M_h._M_single_bucket,4);
    if (bVar1) {
      local_4c4 = 4;
      local_4c0._M_cur =
           (__node_type *)
           ::std::
           unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
           ::find((unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                   *)local_f8,&local_4c4);
      local_4d0._M_cur =
           (__node_type *)
           ::std::
           end<std::unordered_map<unsigned_int,unsigned_int,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>>>
                     ((unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                       *)local_f8);
      bVar1 = ::std::__detail::operator!=(&local_4c0,&local_4d0);
      if (bVar1) {
        ppVar6 = ::std::__detail::
                 _Node_iterator<std::pair<const_unsigned_int,_unsigned_int>,_false,_false>::
                 operator->((_Node_iterator<std::pair<const_unsigned_int,_unsigned_int>,_false,_false>
                             *)&local_4c0);
        statement<char_const(&)[21],unsigned_int&,char_const(&)[25],unsigned_int&,char_const(&)[3]>
                  (this,(char (*) [21])"layout(xfb_offset = ",&ppVar6->second,
                   (char (*) [25])") float gl_CullDistance[",&stack0xffffffffffffff58,
                   (char (*) [3])0x5b704e);
      }
      else {
        statement<char_const(&)[23],unsigned_int&,char_const(&)[3]>
                  (this,(char (*) [23])0x5af986,&stack0xffffffffffffff58,(char (*) [3])0x5b704e);
      }
    }
    if ((clip_distance_size._2_1_ & 1) == 0) {
      end_scope_decl(this);
    }
    else if (((ExecutionModel)emitted_builtins.higher._M_h._M_single_bucket ==
              ExecutionModelTessellationControl) &&
            (emitted_builtins.higher._M_h._M_single_bucket._4_4_ == StorageClassOutput)) {
      uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)(_cull_distance_size + 8));
      (*(this->super_Compiler)._vptr_Compiler[6])(local_510,this,(ulong)uVar3,1);
      pSVar7 = Compiler::get_entry_point(&this->super_Compiler);
      join<std::__cxx11::string,char_const(&)[2],unsigned_int&,char_const(&)[2]>
                (local_4f0,local_510,(char (*) [2])0x5b2ad8,&pSVar7->output_vertices,
                 (char (*) [2])0x5ab046);
      end_scope_decl(this,(string *)local_4f0);
      ::std::__cxx11::string::~string((string *)local_4f0);
      ::std::__cxx11::string::~string((string *)local_510);
    }
    else {
      uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)(_cull_distance_size + 8));
      (*(this->super_Compiler)._vptr_Compiler[6])(local_550,this,(ulong)uVar3,1);
      join<std::__cxx11::string,char_const(&)[3]>(local_530,local_550,(char (*) [3])"[]");
      end_scope_decl(this,(string *)local_530);
      ::std::__cxx11::string::~string((string *)local_530);
      ::std::__cxx11::string::~string((string *)local_550);
    }
    statement<char_const(&)[1]>(this,(char (*) [1])0x5ab0aa);
    attr.stack_storage.aligned_char[0xfc] = '\0';
    attr.stack_storage.aligned_char[0xfd] = '\0';
    attr.stack_storage.aligned_char[0xfe] = '\0';
    attr.stack_storage.aligned_char[0xff] = '\0';
  }
  ::std::
  unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
  ::~unordered_map((unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                    *)local_f8);
  Bitset::~Bitset((Bitset *)&block_var);
  Bitset::~Bitset((Bitset *)&global_builtins.higher._M_h._M_single_bucket);
  return;
}

Assistant:

void CompilerGLSL::emit_declared_builtin_block(StorageClass storage, ExecutionModel model)
{
	Bitset emitted_builtins;
	Bitset global_builtins;
	const SPIRVariable *block_var = nullptr;
	bool emitted_block = false;
	bool builtin_array = false;

	// Need to use declared size in the type.
	// These variables might have been declared, but not statically used, so we haven't deduced their size yet.
	uint32_t cull_distance_size = 0;
	uint32_t clip_distance_size = 0;

	bool have_xfb_buffer_stride = false;
	bool have_geom_stream = false;
	bool have_any_xfb_offset = false;
	uint32_t xfb_stride = 0, xfb_buffer = 0, geom_stream = 0;
	std::unordered_map<uint32_t, uint32_t> builtin_xfb_offsets;

	const auto builtin_is_per_vertex_set = [](BuiltIn builtin) -> bool {
		return builtin == BuiltInPosition || builtin == BuiltInPointSize ||
			builtin == BuiltInClipDistance || builtin == BuiltInCullDistance;
	};

	ir.for_each_typed_id<SPIRVariable>([&](uint32_t, SPIRVariable &var) {
		auto &type = this->get<SPIRType>(var.basetype);
		bool block = has_decoration(type.self, DecorationBlock);
		Bitset builtins;

		if (var.storage == storage && block && is_builtin_variable(var))
		{
			uint32_t index = 0;
			for (auto &m : ir.meta[type.self].members)
			{
				if (m.builtin && builtin_is_per_vertex_set(m.builtin_type))
				{
					builtins.set(m.builtin_type);
					if (m.builtin_type == BuiltInCullDistance)
						cull_distance_size = to_array_size_literal(this->get<SPIRType>(type.member_types[index]));
					else if (m.builtin_type == BuiltInClipDistance)
						clip_distance_size = to_array_size_literal(this->get<SPIRType>(type.member_types[index]));

					if (is_block_builtin(m.builtin_type) && m.decoration_flags.get(DecorationOffset))
					{
						have_any_xfb_offset = true;
						builtin_xfb_offsets[m.builtin_type] = m.offset;
					}

					if (is_block_builtin(m.builtin_type) && m.decoration_flags.get(DecorationStream))
					{
						uint32_t stream = m.stream;
						if (have_geom_stream && geom_stream != stream)
							SPIRV_CROSS_THROW("IO block member Stream mismatch.");
						have_geom_stream = true;
						geom_stream = stream;
					}
				}
				index++;
			}

			if (storage == StorageClassOutput && has_decoration(var.self, DecorationXfbBuffer) &&
			    has_decoration(var.self, DecorationXfbStride))
			{
				uint32_t buffer_index = get_decoration(var.self, DecorationXfbBuffer);
				uint32_t stride = get_decoration(var.self, DecorationXfbStride);
				if (have_xfb_buffer_stride && buffer_index != xfb_buffer)
					SPIRV_CROSS_THROW("IO block member XfbBuffer mismatch.");
				if (have_xfb_buffer_stride && stride != xfb_stride)
					SPIRV_CROSS_THROW("IO block member XfbBuffer mismatch.");
				have_xfb_buffer_stride = true;
				xfb_buffer = buffer_index;
				xfb_stride = stride;
			}

			if (storage == StorageClassOutput && has_decoration(var.self, DecorationStream))
			{
				uint32_t stream = get_decoration(var.self, DecorationStream);
				if (have_geom_stream && geom_stream != stream)
					SPIRV_CROSS_THROW("IO block member Stream mismatch.");
				have_geom_stream = true;
				geom_stream = stream;
			}
		}
		else if (var.storage == storage && !block && is_builtin_variable(var))
		{
			// While we're at it, collect all declared global builtins (HLSL mostly ...).
			auto &m = ir.meta[var.self].decoration;
			if (m.builtin && builtin_is_per_vertex_set(m.builtin_type))
			{
				global_builtins.set(m.builtin_type);
				if (m.builtin_type == BuiltInCullDistance)
					cull_distance_size = to_array_size_literal(type);
				else if (m.builtin_type == BuiltInClipDistance)
					clip_distance_size = to_array_size_literal(type);

				if (is_block_builtin(m.builtin_type) && m.decoration_flags.get(DecorationXfbStride) &&
				    m.decoration_flags.get(DecorationXfbBuffer) && m.decoration_flags.get(DecorationOffset))
				{
					have_any_xfb_offset = true;
					builtin_xfb_offsets[m.builtin_type] = m.offset;
					uint32_t buffer_index = m.xfb_buffer;
					uint32_t stride = m.xfb_stride;
					if (have_xfb_buffer_stride && buffer_index != xfb_buffer)
						SPIRV_CROSS_THROW("IO block member XfbBuffer mismatch.");
					if (have_xfb_buffer_stride && stride != xfb_stride)
						SPIRV_CROSS_THROW("IO block member XfbBuffer mismatch.");
					have_xfb_buffer_stride = true;
					xfb_buffer = buffer_index;
					xfb_stride = stride;
				}

				if (is_block_builtin(m.builtin_type) && m.decoration_flags.get(DecorationStream))
				{
					uint32_t stream = get_decoration(var.self, DecorationStream);
					if (have_geom_stream && geom_stream != stream)
						SPIRV_CROSS_THROW("IO block member Stream mismatch.");
					have_geom_stream = true;
					geom_stream = stream;
				}
			}
		}

		if (builtins.empty())
			return;

		if (emitted_block)
			SPIRV_CROSS_THROW("Cannot use more than one builtin I/O block.");

		emitted_builtins = builtins;
		emitted_block = true;
		builtin_array = !type.array.empty();
		block_var = &var;
	});

	global_builtins =
	    Bitset(global_builtins.get_lower() & ((1ull << BuiltInPosition) | (1ull << BuiltInPointSize) |
	                                          (1ull << BuiltInClipDistance) | (1ull << BuiltInCullDistance)));

	// Try to collect all other declared builtins.
	if (!emitted_block)
		emitted_builtins = global_builtins;

	// Can't declare an empty interface block.
	if (emitted_builtins.empty())
		return;

	if (storage == StorageClassOutput)
	{
		SmallVector<string> attr;
		if (have_xfb_buffer_stride && have_any_xfb_offset)
		{
			if (!options.es)
			{
				if (options.version < 440 && options.version >= 140)
					require_extension_internal("GL_ARB_enhanced_layouts");
				else if (options.version < 140)
					SPIRV_CROSS_THROW("Component decoration is not supported in targets below GLSL 1.40.");
				if (!options.es && options.version < 440)
					require_extension_internal("GL_ARB_enhanced_layouts");
			}
			else if (options.es)
				SPIRV_CROSS_THROW("Need GL_ARB_enhanced_layouts for xfb_stride or xfb_buffer.");
			attr.push_back(join("xfb_buffer = ", xfb_buffer, ", xfb_stride = ", xfb_stride));
		}

		if (have_geom_stream)
		{
			if (get_execution_model() != ExecutionModelGeometry)
				SPIRV_CROSS_THROW("Geometry streams can only be used in geometry shaders.");
			if (options.es)
				SPIRV_CROSS_THROW("Multiple geometry streams not supported in ESSL.");
			if (options.version < 400)
				require_extension_internal("GL_ARB_transform_feedback3");
			attr.push_back(join("stream = ", geom_stream));
		}

		if (model == ExecutionModelMeshEXT)
			statement("out gl_MeshPerVertexEXT");
		else if (!attr.empty())
			statement("layout(", merge(attr), ") out gl_PerVertex");
		else
			statement("out gl_PerVertex");
	}
	else
	{
		// If we have passthrough, there is no way PerVertex cannot be passthrough.
		if (get_entry_point().geometry_passthrough)
			statement("layout(passthrough) in gl_PerVertex");
		else
			statement("in gl_PerVertex");
	}

	begin_scope();
	if (emitted_builtins.get(BuiltInPosition))
	{
		auto itr = builtin_xfb_offsets.find(BuiltInPosition);
		if (itr != end(builtin_xfb_offsets))
			statement("layout(xfb_offset = ", itr->second, ") vec4 gl_Position;");
		else
			statement("vec4 gl_Position;");
	}

	if (emitted_builtins.get(BuiltInPointSize))
	{
		auto itr = builtin_xfb_offsets.find(BuiltInPointSize);
		if (itr != end(builtin_xfb_offsets))
			statement("layout(xfb_offset = ", itr->second, ") float gl_PointSize;");
		else
			statement("float gl_PointSize;");
	}

	if (emitted_builtins.get(BuiltInClipDistance))
	{
		auto itr = builtin_xfb_offsets.find(BuiltInClipDistance);
		if (itr != end(builtin_xfb_offsets))
			statement("layout(xfb_offset = ", itr->second, ") float gl_ClipDistance[", clip_distance_size, "];");
		else
			statement("float gl_ClipDistance[", clip_distance_size, "];");
	}

	if (emitted_builtins.get(BuiltInCullDistance))
	{
		auto itr = builtin_xfb_offsets.find(BuiltInCullDistance);
		if (itr != end(builtin_xfb_offsets))
			statement("layout(xfb_offset = ", itr->second, ") float gl_CullDistance[", cull_distance_size, "];");
		else
			statement("float gl_CullDistance[", cull_distance_size, "];");
	}

	if (builtin_array)
	{
		if (model == ExecutionModelTessellationControl && storage == StorageClassOutput)
			end_scope_decl(join(to_name(block_var->self), "[", get_entry_point().output_vertices, "]"));
		else
			end_scope_decl(join(to_name(block_var->self), "[]"));
	}
	else
		end_scope_decl();
	statement("");
}